

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

void pair0_sock_send(void *arg,nni_aio *aio)

{
  pair0_pipe *p_00;
  _Bool _Var1;
  int iVar2;
  nni_msg *m_00;
  size_t count;
  pair0_pipe *p;
  size_t len;
  nni_msg *m;
  pair0_sock *s;
  nni_aio *aio_local;
  void *arg_local;
  
  m_00 = nni_aio_get_msg(aio);
  count = nni_msg_len(m_00);
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  if ((*(byte *)((long)arg + 0x111) & 1) == 0) {
    iVar2 = nni_lmq_put((nni_lmq *)((long)arg + 0x30),m_00);
    if (iVar2 == 0) {
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      nni_aio_finish(aio,NNG_OK,count);
      _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x30));
      if (_Var1) {
        nni_pollable_clear((nni_pollable *)((long)arg + 0x100));
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 8));
    }
    else {
      _Var1 = nni_aio_start(aio,pair0_cancel,arg);
      if (_Var1) {
        nni_aio_list_append((nni_list *)((long)arg + 0x78),aio);
        nni_mtx_unlock((nni_mtx *)((long)arg + 8));
      }
      else {
        nni_mtx_unlock((nni_mtx *)((long)arg + 8));
      }
    }
  }
  else {
    p_00 = *arg;
    _Var1 = nni_lmq_full((nni_lmq *)((long)arg + 0x30));
    if (_Var1) {
      nni_pollable_clear((nni_pollable *)((long)arg + 0x100));
    }
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_aio_finish(aio,NNG_OK,count);
    pair0_pipe_send(p_00,m_00);
    nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  }
  return;
}

Assistant:

static void
pair0_sock_send(void *arg, nni_aio *aio)
{
	pair0_sock *s = arg;
	nni_msg    *m;
	size_t      len;

	m   = nni_aio_get_msg(aio);
	len = nni_msg_len(m);

	nni_mtx_lock(&s->mtx);
	if (s->wr_ready) {
		pair0_pipe *p = s->p;
		if (nni_lmq_full(&s->wmq)) {
			nni_pollable_clear(&s->writable);
		}
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		pair0_pipe_send(p, m);
		nni_mtx_unlock(&s->mtx);
		return;
	}

	// Can we maybe queue it.
	if (nni_lmq_put(&s->wmq, m) == 0) {
		// Yay, we can.  So we're done.
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		if (nni_lmq_full(&s->wmq)) {
			nni_pollable_clear(&s->writable);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}

	if (!nni_aio_start(aio, pair0_cancel, s)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_aio_list_append(&s->waq, aio);
	nni_mtx_unlock(&s->mtx);
}